

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_cases.h
# Opt level: O0

bool date::cases_reader_t<2ul,1ul>::
     read<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,date::branch_t<date::aliases_t<char,4ul,short,11ul>>,date::branch_t<date::signed_integer_t<short,2u,2u,true>,date::unsigned_integer_t<short,2u,2u>>>
               (iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *pos,
               iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *end,
               cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>
               *fmt)

{
  bool bVar1;
  __tuple_element_t<1UL,_tuple<branch_t<aliases_t<char,_4UL,_short,_11UL>_>,_branch_t<signed_integer_t<short,_2U,_2U,_true>,_unsigned_integer_t<short,_2U,_2U>_>_>_>
  *fmt_00;
  undefined1 local_50 [8];
  iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> begin;
  cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>
  *fmt_local;
  iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *end_local;
  iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *pos_local;
  
  begin.m_position = (size_t)fmt;
  iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::iterator_proxy
            ((iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *)local_50,
             pos);
  fmt_00 = std::
           get<1ul,date::branch_t<date::aliases_t<char,4ul,short,11ul>>,date::branch_t<date::signed_integer_t<short,2u,2u,true>,date::unsigned_integer_t<short,2u,2u>>>
                     ((tuple<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>
                       *)begin.m_position);
  bVar1 = read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,date::signed_integer_t<short,2u,2u,true>,date::unsigned_integer_t<short,2u,2u>>
                    (pos,end,fmt_00);
  if (bVar1) {
    pos_local._7_1_ = true;
  }
  else {
    iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator=
              (pos,(iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *)
                   local_50);
    pos_local._7_1_ =
         cases_reader_t<2ul,0ul>::
         read<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,date::branch_t<date::aliases_t<char,4ul,short,11ul>>,date::branch_t<date::signed_integer_t<short,2u,2u,true>,date::unsigned_integer_t<short,2u,2u>>>
                   (pos,end,(cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>
                             *)begin.m_position);
  }
  return pos_local._7_1_;
}

Assistant:

static bool read(Iterator& pos, const Iterator& end, cases_t<Branches...>& fmt)
    {
        Iterator begin = pos;
        if (read_impl(pos, end, std::get<Count - N>(fmt.branches)))
            return true;
        
        pos = std::move(begin);
        return cases_reader_t<Count, N - 1>::read(pos, end, fmt);
    }